

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O0

BOOL SetFilePointerEx(HANDLE hFile,LARGE_INTEGER liDistanceToMove,PLARGE_INTEGER lpNewFilePointer,
                     DWORD dwMoveMethod)

{
  DWORD local_40;
  LONG local_3c;
  LONG lNewFilePointerLow;
  LONG lDistanceToMoveHigh;
  LONG lDistanceToMove;
  BOOL Ret;
  CPalThread *pThread;
  PAL_ERROR palError;
  DWORD dwMoveMethod_local;
  PLARGE_INTEGER lpNewFilePointer_local;
  HANDLE hFile_local;
  LARGE_INTEGER liDistanceToMove_local;
  
  pThread._0_4_ = 0;
  lDistanceToMoveHigh = 0;
  pThread._4_4_ = dwMoveMethod;
  _palError = lpNewFilePointer;
  lpNewFilePointer_local = (PLARGE_INTEGER)hFile;
  hFile_local = (HANDLE)liDistanceToMove;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  hFile_local._0_4_ = liDistanceToMove.field_0.LowPart;
  lNewFilePointerLow = (DWORD)hFile_local;
  hFile_local._4_4_ = liDistanceToMove.field_0.HighPart;
  local_3c = hFile_local._4_4_;
  local_40 = 0;
  _lDistanceToMove = CorUnix::InternalGetCurrentThread();
  pThread._0_4_ =
       CorUnix::InternalSetFilePointer
                 (_lDistanceToMove,lpNewFilePointer_local,lNewFilePointerLow,&local_3c,pThread._4_4_
                  ,(PLONG)&local_40);
  if ((PAL_ERROR)pThread == 0) {
    if (_palError != (PLARGE_INTEGER)0x0) {
      (_palError->field_0).LowPart = local_40;
      (_palError->field_0).HighPart = local_3c;
    }
    lDistanceToMoveHigh = 1;
  }
  else {
    CorUnix::CPalThread::SetLastError((PAL_ERROR)pThread);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return lDistanceToMoveHigh;
}

Assistant:

BOOL
PALAPI
SetFilePointerEx(
           IN HANDLE hFile,
           IN LARGE_INTEGER liDistanceToMove,
           OUT PLARGE_INTEGER lpNewFilePointer,
           IN DWORD dwMoveMethod)
{
    PAL_ERROR palError = NO_ERROR;
    CPalThread *pThread;
    BOOL Ret = FALSE;

    PERF_ENTRY(SetFilePointerEx);
    ENTRY("SetFilePointerEx(hFile=%p, liDistanceToMove=0x%llx, "
           "lpNewFilePointer=%p (0x%llx), dwMoveMethod=0x%x)\n", hFile, 
           liDistanceToMove.QuadPart, lpNewFilePointer, 
           (lpNewFilePointer) ? (*lpNewFilePointer).QuadPart : 0, dwMoveMethod);

    LONG lDistanceToMove;
    lDistanceToMove = (LONG)liDistanceToMove.u.LowPart;
    LONG lDistanceToMoveHigh;
    lDistanceToMoveHigh = liDistanceToMove.u.HighPart;

    LONG lNewFilePointerLow = 0;

    pThread = InternalGetCurrentThread();

    palError = InternalSetFilePointer(
        pThread,
        hFile,
        lDistanceToMove,
        &lDistanceToMoveHigh,
        dwMoveMethod,
        &lNewFilePointerLow
        );

    if (NO_ERROR != palError)
    {
        pThread->SetLastError(palError);
    }
    else
    {
        if (lpNewFilePointer != NULL)
        {
            lpNewFilePointer->u.LowPart = (DWORD)lNewFilePointerLow;
            lpNewFilePointer->u.HighPart = (DWORD)lDistanceToMoveHigh;
        }
        Ret = TRUE;
    }
    
    LOGEXIT("SetFilePointerEx returns BOOL %d\n", Ret);
    PERF_EXIT(SetFilePointerEx);
    return Ret;
}